

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O1

ngx_int_t ngx_http_variable_remote_addr
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  *(uint *)v = (*(uint *)v & 0x80000000) + ((uint)(r->connection->addr_text).len & 0xfffffff) +
               0x10000000;
  v->data = (r->connection->addr_text).data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_remote_addr(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    v->len = r->connection->addr_text.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = r->connection->addr_text.data;

    return NGX_OK;
}